

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O0

void __thiscall
TransactionApi_EstimateFee_CheckRealValue_Test::TestBody
          (TransactionApi_EstimateFee_CheckRealValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  AssertionResult gtest_ar_6;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Amount fee;
  Address address2;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  ByteData *in_stack_ffffffffffffce78;
  Script *in_stack_ffffffffffffce80;
  uint *in_stack_ffffffffffffce88;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffce90;
  undefined4 in_stack_ffffffffffffce98;
  undefined4 in_stack_ffffffffffffce9c;
  undefined4 in_stack_ffffffffffffcea8;
  undefined4 in_stack_ffffffffffffceac;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffceb0;
  undefined7 in_stack_ffffffffffffceb8;
  undefined1 in_stack_ffffffffffffcebf;
  size_type in_stack_ffffffffffffcec0;
  UtxoData *local_3028;
  AssertHelper local_2f98;
  Message local_2f90;
  undefined4 local_2f84;
  AssertionResult local_2f80;
  int local_2f6c;
  AssertHelper local_2f68;
  Message local_2f60;
  undefined4 local_2f58;
  undefined4 local_2f54;
  AssertionResult local_2f50;
  AssertHelper local_2f40;
  Message local_2f38;
  string local_2f30 [32];
  AssertionResult local_2f10;
  AssertHelper local_2f00;
  Message local_2ef8;
  undefined8 local_2ef0;
  undefined8 local_2ee8;
  undefined1 local_2ee0;
  undefined8 local_2ed8;
  undefined1 local_2ed0;
  undefined8 local_2ec8;
  AssertionResult local_2ec0;
  AssertHelper local_2eb0;
  Message local_2ea8 [4];
  AssertHelper local_2e88;
  Message local_2e80;
  OutPoint local_2e78;
  AssertHelper local_2e50;
  Message local_2e48;
  SigHashType local_2e40 [15];
  allocator local_2e31;
  string local_2e30 [32];
  string local_2e10 [39];
  allocator local_2de9;
  string local_2de8 [32];
  Pubkey local_2dc8;
  OutPoint local_2db0;
  AssertHelper local_2d88;
  Message local_2d80 [5];
  byte local_2d51;
  ConstCharPtr local_2d50;
  AssertHelper local_2d48;
  Message local_2d40;
  OutPoint local_2d38;
  AssertHelper local_2d10;
  Message local_2d08;
  SigHashType local_2d00 [15];
  allocator local_2cf1;
  string local_2cf0 [32];
  string local_2cd0 [39];
  allocator local_2ca9;
  string local_2ca8 [32];
  Pubkey local_2c88;
  OutPoint local_2c70;
  AssertHelper local_2c48;
  Message local_2c40 [5];
  byte local_2c11;
  ConstCharPtr local_2c10;
  AssertHelper local_2c08;
  Message local_2c00;
  OutPoint local_2bf8;
  AssertHelper local_2bd0;
  Message local_2bc8;
  SigHashType local_2bc0 [15];
  allocator local_2bb1;
  string local_2bb0 [32];
  string local_2b90 [39];
  allocator local_2b69;
  string local_2b68 [32];
  Pubkey local_2b48;
  OutPoint local_2b30;
  ByteData local_2b08;
  AssertHelper local_2af0;
  Message local_2ae8;
  undefined4 local_2adc;
  undefined8 local_2ad8;
  AssertionResult local_2ad0;
  AssertHelper local_2ac0;
  Message local_2ab8;
  undefined4 local_2aac;
  undefined8 local_2aa8;
  AssertionResult local_2aa0;
  AssertHelper local_2a90;
  Message local_2a88;
  undefined4 local_2a7c;
  undefined8 local_2a78;
  AssertionResult local_2a70;
  undefined8 local_2a60;
  undefined1 local_2a58;
  vector local_2a50 [32];
  undefined8 local_2a30;
  undefined1 local_2a28;
  TransactionApi local_2a19;
  Amount local_2a18 [16];
  Amount local_2a08 [16];
  undefined8 local_29f8;
  undefined1 local_29f0;
  double local_29e8;
  AssertHelper local_29e0;
  Message local_29d8 [2];
  UtxoData *local_29c8;
  UtxoData local_29c0 [1264];
  UtxoData local_24d0 [1264];
  UtxoData local_1fe0 [1264];
  UtxoData *local_1af0;
  undefined8 local_1ae8;
  Amount local_1ae0 [24];
  undefined8 local_1ac8;
  undefined1 local_1ac0;
  undefined8 local_1ab8;
  undefined1 local_1ab0;
  undefined8 local_1aa8;
  undefined1 local_1aa0;
  undefined8 local_1a98;
  undefined1 local_1a90;
  OutPoint local_1a88;
  OutPoint local_1a60;
  AssertHelper local_1a38;
  Message local_1a30 [2];
  OutPoint local_1a20 [4];
  Amount local_1968 [23];
  allocator local_1951;
  string local_1950 [32];
  Address local_1930 [383];
  allocator local_17b1;
  string local_17b0 [32];
  Address local_1790 [376];
  undefined8 local_1618;
  undefined1 local_1610;
  allocator local_1601;
  string local_1600 [32];
  string local_15e0 [383];
  allocator local_1461;
  string local_1460 [32];
  Script local_1440;
  allocator local_1401;
  string local_1400 [32];
  Txid local_13e0;
  undefined8 local_13c0 [5];
  Txid local_1398;
  uint local_1378;
  Script local_1370 [2];
  Address local_1300 [376];
  string local_1188 [32];
  undefined8 local_1168;
  undefined1 local_1160;
  undefined4 local_1158;
  undefined8 local_1150;
  undefined8 local_ed0;
  undefined1 local_ec8;
  allocator local_eb9;
  string local_eb8 [32];
  string local_e98 [383];
  allocator local_d19;
  string local_d18 [32];
  Script local_cf8;
  allocator local_cb9;
  string local_cb8 [32];
  Txid local_c98;
  undefined8 local_c78 [5];
  Txid local_c50;
  uint local_c30;
  Script local_c28 [2];
  Address local_bb8 [376];
  string local_a40 [32];
  undefined8 local_a20;
  undefined1 local_a18;
  undefined4 local_a10;
  undefined8 local_a08;
  undefined8 local_788;
  undefined1 local_780;
  allocator local_771;
  string local_770 [32];
  string local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  Script local_5b0;
  allocator local_571;
  string local_570 [32];
  Txid local_550;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  string local_2e8 [32];
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  AddressFactory local_30;
  
  cfd::AddressFactory::AddressFactory(&local_30,kRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_571
            );
  cfd::core::Txid::Txid(&local_550,local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2a5446);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script(in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",&local_771);
  cfd::AddressFactory::GetAddress(local_750);
  cfd::core::Address::operator=(local_460,(Address *)local_750);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_788,10000000);
  local_2c0 = local_780;
  local_2c8 = local_788;
  local_2b8 = 2;
  cfd::UtxoData::UtxoData((UtxoData *)local_c78);
  local_c78[0] = 0;
  local_a08 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cb8,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_cb9
            );
  cfd::core::Txid::Txid(&local_c98,local_cb8);
  cfd::core::Txid::operator=(&local_c50,&local_c98);
  cfd::core::Txid::~Txid((Txid *)0x2a566b);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  local_c30 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d18,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d19);
  cfd::core::Script::Script(&local_cf8,local_d18);
  cfd::core::Script::operator=(local_c28,&local_cf8);
  cfd::core::Script::~Script(in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",&local_eb9);
  cfd::AddressFactory::GetAddress(local_e98);
  cfd::core::Address::operator=(local_bb8,(Address *)local_e98);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::operator=
            (local_a40,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount((Amount *)&local_ed0,180000);
  local_a18 = local_ec8;
  local_a20 = local_ed0;
  local_a10 = 6;
  cfd::UtxoData::UtxoData((UtxoData *)local_13c0);
  local_13c0[0] = 0;
  local_1150 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1400,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             &local_1401);
  cfd::core::Txid::Txid(&local_13e0,local_1400);
  cfd::core::Txid::operator=(&local_1398,&local_13e0);
  cfd::core::Txid::~Txid((Txid *)0x2a5890);
  std::__cxx11::string::~string(local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  local_1378 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1460,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1461);
  cfd::core::Script::Script(&local_1440,local_1460);
  cfd::core::Script::operator=(local_1370,&local_1440);
  cfd::core::Script::~Script(in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1600,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",&local_1601);
  cfd::AddressFactory::GetAddress(local_15e0);
  cfd::core::Address::operator=(local_1300,(Address *)local_15e0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce80);
  std::__cxx11::string::~string(local_1600);
  std::allocator<char>::~allocator((allocator<char> *)&local_1601);
  std::__cxx11::string::operator=
            (local_1188,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_1618,10000000);
  local_1160 = local_1610;
  local_1168 = local_1618;
  local_1158 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_17b1);
  cfd::core::Address::Address(local_1790,local_17b0);
  std::__cxx11::string::~string(local_17b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1950,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1951);
  cfd::core::Address::Address(local_1930,local_1950);
  std::__cxx11::string::~string(local_1950);
  std::allocator<char>::~allocator((allocator<char> *)&local_1951);
  cfd::core::Amount::Amount(local_1968,10000);
  cfd::TransactionContext::TransactionContext((TransactionContext *)local_1a20,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput((UtxoData *)local_1a20);
    }
  }
  else {
    testing::Message::Message(local_1a30);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x5b,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1a38,local_1a30);
    testing::internal::AssertHelper::~AssertHelper(&local_1a38);
    testing::Message::~Message((Message *)0x2a6103);
  }
  cfd::core::OutPoint::OutPoint(&local_1a60,&local_c50,local_c30);
  cfd::TransactionContext::AddTxIn(local_1a20);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a6190);
  cfd::core::OutPoint::OutPoint(&local_1a88,&local_1398,local_1378);
  cfd::TransactionContext::AddTxIn(local_1a20);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a61d2);
  local_1ab8 = cfd::core::operator+((Amount *)&local_2c8,(Amount *)&local_1168);
  local_1ab0 = extraout_DL;
  local_1aa8 = local_1ab8;
  local_1aa0 = extraout_DL;
  local_1ac8 = cfd::core::operator-((Amount *)&local_1aa8,local_1968);
  local_1ac0 = extraout_DL_00;
  local_1a98 = local_1ac8;
  local_1a90 = extraout_DL_00;
  cfd::TransactionContext::AddTxOut((Address *)local_1a20,(Amount *)local_1790);
  cfd::TransactionContext::AddTxOut((Address *)local_1a20,(Amount *)local_1930);
  local_29c8 = local_29c0;
  cfd::UtxoData::UtxoData(local_29c8,(UtxoData *)local_520);
  local_29c8 = local_24d0;
  cfd::UtxoData::UtxoData(local_29c8,(UtxoData *)local_c78);
  local_29c8 = local_1fe0;
  cfd::UtxoData::UtxoData(local_29c8,(UtxoData *)local_13c0);
  local_1af0 = local_29c0;
  local_1ae8 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2a6362);
  __l._M_array._7_1_ = in_stack_ffffffffffffcebf;
  __l._M_array._0_7_ = in_stack_ffffffffffffceb8;
  __l._M_len = in_stack_ffffffffffffcec0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffceb0,__l,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffceac,in_stack_ffffffffffffcea8));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2a6396);
  local_3028 = (UtxoData *)&local_1af0;
  do {
    local_3028 = local_3028 + -0x4f0;
    cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce80);
  } while (local_3028 != local_29c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo((vector *)local_1a20);
    }
  }
  else {
    testing::Message::Message(local_29d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_29e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x62,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_29e0,local_29d8);
    testing::internal::AssertHelper::~AssertHelper(&local_29e0);
    testing::Message::~Message((Message *)0x2a663b);
  }
  local_29e8 = 20.0;
  cfd::core::Amount::Amount((Amount *)&local_29f8);
  cfd::core::Amount::Amount(local_2a08);
  cfd::core::Amount::Amount(local_2a18);
  cfd::api::TransactionApi::TransactionApi(&local_2a19);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  local_2a60 = cfd::api::TransactionApi::EstimateFee
                         ((string *)&local_2a19,local_2a50,local_1ae0,local_2a18,local_29e8);
  local_2a58 = extraout_DL_01;
  local_2a30 = local_2a60;
  local_2a28 = extraout_DL_01;
  local_29f8 = local_2a60;
  local_29f0 = extraout_DL_01;
  std::__cxx11::string::~string((string *)local_2a50);
  local_2a78 = cfd::core::Amount::GetSatoshiValue();
  local_2a7c = 0x1e3c;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT44(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98),
             (char *)in_stack_ffffffffffffce90,(long *)in_stack_ffffffffffffce88,
             (int *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a70);
  if (!bVar1) {
    testing::Message::Message(&local_2a88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a687b);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a90,&local_2a88);
    testing::internal::AssertHelper::~AssertHelper(&local_2a90);
    testing::Message::~Message((Message *)0x2a68de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a6936);
  local_2aa8 = cfd::core::Amount::GetSatoshiValue();
  local_2aac = 0x604;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT44(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98),
             (char *)in_stack_ffffffffffffce90,(long *)in_stack_ffffffffffffce88,
             (int *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2aa0);
  if (!bVar1) {
    testing::Message::Message(&local_2ab8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a6a04);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2ac0,&local_2ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_2ac0);
    testing::Message::~Message((Message *)0x2a6a67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a6abf);
  local_2ad8 = cfd::core::Amount::GetSatoshiValue();
  local_2adc = 0x1838;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT44(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98),
             (char *)in_stack_ffffffffffffce90,(long *)in_stack_ffffffffffffce88,
             (int *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2ad0);
  if (!bVar1) {
    testing::Message::Message(&local_2ae8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a6b8d);
    testing::internal::AssertHelper::AssertHelper
              (&local_2af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2af0,&local_2ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_2af0);
    testing::Message::~Message((Message *)0x2a6bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a6c48);
  cfd::core::ByteData::ByteData(&local_2b08);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2b30,&local_4f8,local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b68,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_2b69);
      cfd::core::Pubkey::Pubkey(&local_2b48,local_2b68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2bb0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_2bb1);
      cfd::core::Privkey::FromWif(local_2b90,(NetType)local_2bb0,true);
      cfd::core::SigHashType::SigHashType(local_2bc0);
      in_stack_ffffffffffffce80 = (Script *)0x0;
      in_stack_ffffffffffffce78 = (ByteData *)0x0;
      cfd::TransactionContext::SignWithKey
                (local_1a20,&local_2b30,&local_2b48,local_2b90,local_2bc0,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x2a6daf);
      std::__cxx11::string::~string(local_2bb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2bb1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a6dd6);
      std::__cxx11::string::~string(local_2b68);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b69);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a6dfd);
    }
  }
  else {
    testing::Message::Message(&local_2bc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x75,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2bd0,&local_2bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_2bd0);
    testing::Message::~Message((Message *)0x2a6fa1);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2bf8,&local_4f8,local_4d8);
      cfd::TransactionContext::Verify(local_1a20);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a706a);
    }
  }
  else {
    testing::Message::Message(&local_2c00);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x76,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2c08,&local_2c00);
    testing::internal::AssertHelper::~AssertHelper(&local_2c08);
    testing::Message::~Message((Message *)0x2a7134);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2c10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2c10);
  if (bVar1) {
    local_2c11 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffce80,in_stack_ffffffffffffce78);
      cfd::core::ByteData::~ByteData((ByteData *)0x2a721a);
    }
    if ((local_2c11 & 1) == 0) {
      local_2c10.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002a72bd;
    }
  }
  else {
LAB_002a72bd:
    testing::Message::Message(local_2c40);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x77,local_2c10.value);
    testing::internal::AssertHelper::operator=(&local_2c48,local_2c40);
    testing::internal::AssertHelper::~AssertHelper(&local_2c48);
    testing::Message::~Message((Message *)0x2a7325);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2c70,&local_c50,local_c30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2ca8,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
                 &local_2ca9);
      cfd::core::Pubkey::Pubkey(&local_2c88,local_2ca8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2cf0,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",&local_2cf1);
      cfd::core::Privkey::FromWif(local_2cd0,(NetType)local_2cf0,true);
      cfd::core::SigHashType::SigHashType(local_2d00);
      in_stack_ffffffffffffce80 = (Script *)0x0;
      in_stack_ffffffffffffce78 = (ByteData *)0x0;
      cfd::TransactionContext::SignWithKey
                (local_1a20,&local_2c70,&local_2c88,local_2cd0,local_2d00,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x2a74c8);
      std::__cxx11::string::~string(local_2cf0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2cf1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a74ef);
      std::__cxx11::string::~string(local_2ca8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2ca9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a7516);
    }
  }
  else {
    testing::Message::Message(&local_2d08);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x7c,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d10,&local_2d08);
    testing::internal::AssertHelper::~AssertHelper(&local_2d10);
    testing::Message::~Message((Message *)0x2a768f);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2d38,&local_c50,local_c30);
      cfd::TransactionContext::Verify(local_1a20);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a7758);
    }
  }
  else {
    testing::Message::Message(&local_2d40);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x7d,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d48,&local_2d40);
    testing::internal::AssertHelper::~AssertHelper(&local_2d48);
    testing::Message::~Message((Message *)0x2a7822);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2d50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2d50);
  if (bVar1) {
    local_2d51 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffce80,in_stack_ffffffffffffce78);
      cfd::core::ByteData::~ByteData((ByteData *)0x2a7908);
    }
    if ((local_2d51 & 1) != 0) goto LAB_002a7a5e;
    local_2d50.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2d80);
  testing::internal::AssertHelper::AssertHelper
            (&local_2d88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
             ,0x7e,local_2d50.value);
  testing::internal::AssertHelper::operator=(&local_2d88,local_2d80);
  testing::internal::AssertHelper::~AssertHelper(&local_2d88);
  testing::Message::~Message((Message *)0x2a7a13);
LAB_002a7a5e:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2db0,&local_1398,local_1378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2de8,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_2de9);
      cfd::core::Pubkey::Pubkey(&local_2dc8,local_2de8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e30,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_2e31);
      cfd::core::Privkey::FromWif(local_2e10,(NetType)local_2e30,true);
      cfd::core::SigHashType::SigHashType(local_2e40);
      in_stack_ffffffffffffce80 = (Script *)0x0;
      in_stack_ffffffffffffce78 = (ByteData *)0x0;
      cfd::TransactionContext::SignWithKey
                (local_1a20,&local_2db0,&local_2dc8,local_2e10,local_2e40,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x2a7bb6);
      std::__cxx11::string::~string(local_2e30);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e31);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2a7bdd);
      std::__cxx11::string::~string(local_2de8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2de9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a7c04);
    }
  }
  else {
    testing::Message::Message(&local_2e48);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x83,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2e50,&local_2e48);
    testing::internal::AssertHelper::~AssertHelper(&local_2e50);
    testing::Message::~Message((Message *)0x2a7d7d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2e78,&local_1398,local_1378);
      cfd::TransactionContext::Verify(local_1a20);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2a7e3a);
    }
  }
  else {
    testing::Message::Message(&local_2e80);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x84,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2e88,&local_2e80);
    testing::internal::AssertHelper::~AssertHelper(&local_2e88);
    testing::Message::~Message((Message *)0x2a7f04);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffce80,in_stack_ffffffffffffce78);
      cfd::core::ByteData::~ByteData((ByteData *)0x2a7fb5);
    }
  }
  else {
    testing::Message::Message(local_2ea8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2eb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x86,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2eb0,local_2ea8);
    testing::internal::AssertHelper::~AssertHelper(&local_2eb0);
    testing::Message::~Message((Message *)0x2a805c);
  }
  local_2ee8 = cfd::TransactionContext::GetFeeAmount();
  local_2ee0 = extraout_DL_02;
  local_2ed8 = local_2ee8;
  local_2ed0 = extraout_DL_02;
  local_2ec8 = cfd::core::Amount::GetSatoshiValue();
  local_2ef0 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT44(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98),
             (char *)in_stack_ffffffffffffce90,(long *)in_stack_ffffffffffffce88,
             (long *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2ec0);
  if (!bVar1) {
    testing::Message::Message(&local_2ef8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a81bb);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f00,&local_2ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f00);
    testing::Message::~Message((Message *)0x2a8218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a8270);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2f10,"tx.GetHex().c_str()",
             "\"02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000\""
             ,pcVar3,
             "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000"
            );
  std::__cxx11::string::~string(local_2f30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f10);
  if (!bVar1) {
    testing::Message::Message(&local_2f38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a8357);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f40,&local_2f38);
    testing::internal::AssertHelper::~AssertHelper(&local_2f40);
    testing::Message::~Message((Message *)0x2a83b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a840c);
  local_2f54 = cfd::core::Transaction::GetVsize();
  local_2f58 = 0x17e;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffce9c,in_stack_ffffffffffffce98),
             (char *)in_stack_ffffffffffffce90,in_stack_ffffffffffffce88,
             (int *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f50);
  if (!bVar1) {
    testing::Message::Message(&local_2f60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2a84cb);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f68,&local_2f60);
    testing::internal::AssertHelper::~AssertHelper(&local_2f68);
    testing::Message::~Message((Message *)0x2a8528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a8580);
  iVar2 = cfd::core::Transaction::GetVsize();
  local_2f6c = iVar2 * (int)(long)local_29e8;
  local_2f84 = 0x1dd8;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffce98),(char *)in_stack_ffffffffffffce90,
             in_stack_ffffffffffffce88,(int *)in_stack_ffffffffffffce80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f80);
  if (!bVar1) {
    testing::Message::Message(&local_2f90);
    in_stack_ffffffffffffce90 =
         (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x2a864c);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_transaction.cpp"
               ,0x8c,(char *)in_stack_ffffffffffffce90);
    testing::internal::AssertHelper::operator=(&local_2f98,&local_2f90);
    testing::internal::AssertHelper::~AssertHelper(&local_2f98);
    testing::Message::~Message((Message *)0x2a86a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2a8701);
  cfd::core::ByteData::~ByteData((ByteData *)0x2a870e);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(in_stack_ffffffffffffce90);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffce80);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce80);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffce80);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce80);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce80);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_ffffffffffffce80);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x2a8776);
  return;
}

Assistant:

TEST(TransactionApi, EstimateFee_CheckRealValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{10000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxIn(OutPoint(utxo3.txid, utxo3.vout));
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 20.0;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  TransactionApi api;
  calc_fee = api.EstimateFee(
      txc.GetHex(), utxos, &tx_fee, &utxo_fee, effective_fee_rate);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 7740);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 1540);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 6200);

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200710e3ab10644ebe6bc8934899743cb7a3d127411b4db8ffcdd6a75c03c917760220143a55a35926d9d719d1eed902bcf7dbd5f54fe9830ea653d14895a80535a33f01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffff02f0053101000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca000247304402204583781dada5f2173ef1c60e8d1d93df0edec0fb6aaf46f41639b04446dddb7e02200ff89839302e4325c54ef818ce8fd2dfa3d1f2a62a3fc67ddd62d89f2a07078501210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270247304402207e3807d4a520cdd219791a4a7637d37ce6ae172c03292e525d3bf6ea88d356930220713ddd154bf5c7bcb67f2bf44d39a8fba6048cca9af80a0abf13ee61206cb40d01210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000");
  EXPECT_EQ(txc.GetVsize(), 382);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 7640);
}